

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O2

void __thiscall xmrig::OclCnRunner::~OclCnRunner(OclCnRunner *this)

{
  CnBranchKernel *pCVar1;
  size_t i;
  long lVar2;
  
  (this->super_OclBaseRunner).super_IOclRunner._vptr_IOclRunner =
       (_func_int **)&PTR__OclCnRunner_001bc2a0;
  if (this->m_cn1 != (Cn1Kernel *)0x0) {
    (*(this->m_cn1->super_OclKernel)._vptr_OclKernel[1])();
  }
  if (this->m_cn2 != (Cn2Kernel *)0x0) {
    (*(this->m_cn2->super_OclKernel)._vptr_OclKernel[1])();
  }
  OclLib::release(this->m_scratchpads);
  OclLib::release(this->m_states);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    pCVar1 = (this->m_branchKernels).
             super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar2];
    if (pCVar1 != (CnBranchKernel *)0x0) {
      (*(pCVar1->super_OclKernel)._vptr_OclKernel[1])();
    }
    OclLib::release((this->m_branches).super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar2]);
  }
  std::_Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::
  ~_Vector_base(&(this->m_branchKernels).
                 super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
               );
  std::_Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>::~_Vector_base
            (&(this->m_branches).super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>);
  OclBaseRunner::~OclBaseRunner(&this->super_OclBaseRunner);
  return;
}

Assistant:

xmrig::OclCnRunner::~OclCnRunner()
{
    delete m_cn1;
    delete m_cn2;

    OclLib::release(m_scratchpads);
    OclLib::release(m_states);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        delete m_branchKernels[i];
        OclLib::release(m_branches[i]);
    }
}